

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvstore.cpp
# Opt level: O3

void __thiscall KVStore::~KVStore(KVStore *this)

{
  ~KVStore(this);
  operator_delete(this,0x2790);
  return;
}

Assistant:

KVStore::~KVStore() {
  if (memTable.getLength() > 0) {
    if (!utils::dirExists(storagePath + "/level-0"))
      utils::mkdir((storagePath + "/level-0").c_str());
    auto fileName = storagePath + "/level-0/" + to_string(fileNums++) + ".sst";
    SSTable::toSSTable(memTable, fileName, timeStamp);
    cache.emplace(fileName, new SSTableCache(memTable, timeStamp, fileName));
    compaction(0);
  }

  for (auto &c : cache) delete c.second;
}